

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream,uint options)

{
  xml_document_struct *doc;
  undefined *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  void *contents;
  ulong uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  ulong uVar11;
  void *__dest;
  xml_parse_status xVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  
  _destroy(this);
  _create(this);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    goto LAB_0036577d;
  }
  doc = (xml_document_struct *)(this->super_xml_node)._root;
  lVar4 = std::wistream::tellg();
  if (lVar4 < 0) {
    puVar10 = (undefined8 *)0x0;
    std::wios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
    uVar3 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
    puVar9 = (undefined8 *)0x0;
    uVar11 = 0;
LAB_00365560:
    if ((uVar3 & 2) == 0) {
      puVar6 = (undefined8 *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(0x7fe8);
      if (puVar6 == (undefined8 *)0x0) {
LAB_0036570f:
        xVar12 = status_out_of_memory;
        uVar11 = 0;
        contents = (void *)0x0;
        bVar13 = false;
      }
      else {
        *puVar6 = 0;
        puVar6[1] = 0;
        puVar2 = puVar6;
        if (puVar9 != (undefined8 *)0x0) {
          *puVar9 = puVar6;
          puVar2 = puVar10;
        }
        puVar10 = puVar2;
        std::wistream::read((wchar_t *)stream,(long)(puVar6 + 2));
        uVar7 = *(long *)(stream + 8) * 4;
        puVar6[1] = uVar7;
        uVar3 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
        if (((uVar3 & 1) == 0) && ((uVar3 & 6) != 4)) goto code_r0x003655df;
        contents = (void *)0x0;
        uVar11 = 0;
        bVar13 = false;
        xVar12 = status_io_error;
      }
    }
    else {
      contents = (void *)(*(code *)impl::(anonymous_namespace)::
                                   xml_memory_management_function_storage<int>::allocate)
                                   (uVar11 + 1);
      if (contents == (void *)0x0) goto LAB_0036570f;
      __dest = contents;
      if (puVar10 != (undefined8 *)0x0) {
        puVar9 = puVar10;
        do {
          if (uVar11 + (long)contents < (ulong)((long)__dest + puVar9[1])) {
            __assert_fail("write + chunk->size <= buffer + total",
                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                          ,0x1359,
                          "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                         );
          }
          memcpy(__dest,puVar9 + 2,puVar9[1]);
          __dest = (void *)((long)__dest + puVar9[1]);
          puVar9 = (undefined8 *)*puVar9;
        } while (puVar9 != (undefined8 *)0x0);
      }
      if (__dest != (void *)((long)contents + uVar11)) {
        __assert_fail("write == buffer + total",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x135e,
                      "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                     );
      }
      xVar12 = status_ok;
      bVar13 = true;
    }
    goto joined_r0x0036571b;
  }
  auVar14 = std::wistream::tellg();
  lVar4 = auVar14._0_8_;
  std::wistream::seekg((long)stream,_S_beg);
  lVar5 = std::wistream::tellg();
  std::wistream::seekg(stream,lVar4,auVar14._8_8_);
  if (-1 < lVar4 && ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    uVar11 = lVar5 - lVar4;
    xVar12 = status_out_of_memory;
    if (((long)uVar11 < 0) ||
       (contents = (void *)(*(code *)impl::(anonymous_namespace)::
                                     xml_memory_management_function_storage<int>::allocate)
                                     (uVar11 * 4 + 1),
       puVar1 = impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
       , contents == (void *)0x0)) goto LAB_00365771;
    std::wistream::read((wchar_t *)stream,(long)contents);
    if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) != 4 &&
        (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) == 0) {
      if (uVar11 < *(ulong *)(stream + 8)) {
        __assert_fail("actual_length <= read_length",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x1383,
                      "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_seek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                     );
      }
      uVar11 = *(ulong *)(stream + 8) << 2;
      goto LAB_0036573f;
    }
    (*(code *)puVar1)(contents);
  }
  xVar12 = status_io_error;
  goto LAB_00365771;
code_r0x003655df:
  uVar8 = uVar7 + uVar11;
  if (uVar7 + uVar11 <= uVar11) {
    uVar8 = uVar11;
  }
  bVar13 = CARRY8(uVar7,uVar11);
  puVar9 = puVar6;
  uVar11 = uVar8;
  if (bVar13) goto code_r0x003655fc;
  goto LAB_00365560;
code_r0x003655fc:
  uVar11 = 0;
  contents = (void *)0x0;
  bVar13 = false;
  xVar12 = status_out_of_memory;
joined_r0x0036571b:
  while (puVar10 != (undefined8 *)0x0) {
    puVar9 = (undefined8 *)*puVar10;
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (puVar10);
    puVar10 = puVar9;
  }
  if (bVar13) {
LAB_0036573f:
    impl::anon_unknown_0::load_buffer_impl
              (__return_storage_ptr__,doc,(xml_node_struct *)doc,contents,uVar11,options,
               encoding_utf32_le,true,true,&this->_buffer);
    return __return_storage_ptr__;
  }
LAB_00365771:
  xml_parse_result::xml_parse_result(__return_storage_ptr__);
  __return_storage_ptr__->status = xVar12;
LAB_0036577d:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load(std::basic_istream<wchar_t, std::char_traits<wchar_t> >& stream, unsigned int options)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding_wchar, &_buffer);
	}